

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningParameter.cpp
# Opt level: O3

void __thiscall
DIS::DeadReckoningParameter::marshal(DeadReckoningParameter *this,DataStream *dataStream)

{
  long lVar1;
  
  DataStream::operator<<(dataStream,this->_deadReckoningAlgorithm);
  lVar1 = -0xf;
  do {
    DataStream::operator<<(dataStream,this->_otherParameters[lVar1 + 0xf]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  Vector3Float::marshal(&this->_entityLinearAcceleration,dataStream);
  Vector3Float::marshal(&this->_entityAngularVelocity,dataStream);
  return;
}

Assistant:

void DeadReckoningParameter::marshal(DataStream& dataStream) const
{
    dataStream << _deadReckoningAlgorithm;

     for(size_t idx = 0; idx < 15; idx++)
     {
        dataStream << _otherParameters[idx];
     }

    _entityLinearAcceleration.marshal(dataStream);
    _entityAngularVelocity.marshal(dataStream);
}